

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.h
# Opt level: O3

void __thiscall libnbt::NBTTagData<short>::setType(NBTTagData<short> *this)

{
  int iVar1;
  char cVar2;
  
  cVar2 = '\x01';
  if (_operator_new != _get) {
    if (*_operator_new != '*') {
      iVar1 = strcmp(_operator_new,_get);
      if (iVar1 == 0) goto LAB_001095d5;
    }
    cVar2 = '\x02';
  }
LAB_001095d5:
  (this->super_NBTBase).type = cVar2;
  return;
}

Assistant:

void setType() {
            if (typeid(T) == typeid(int8_t)) {
                type = BYTE;
            } else if (typeid(T) == typeid(int16_t)) {
                type = SHORT;
            } else if (typeid(T) == typeid(int32_t)) {
                type = INT;
            } else if (typeid(T) == typeid(int64_t)) {
                type = LONG;
            } else if (typeid(T) == typeid(float)) {
                type = FLOAT;
            } else if (typeid(T) == typeid(double)) {
                type = DOUBLE;
            } else if (typeid(T) == typeid(std::string)) {
                type = STRING;
            } else {
                type = END;
            }
        }